

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O2

int fft_segment_fwd(mixed_segment *segment)

{
  uint n;
  uint uVar1;
  long lVar2;
  float *pSrc;
  long lVar3;
  long lVar4;
  ulong uVar5;
  undefined4 *puVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 *puVar9;
  double dVar10;
  double dVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar13;
  double __x;
  uint32_t out_samples;
  undefined8 *local_a0;
  uint32_t in_samples;
  long local_90;
  ulong local_88;
  ulong local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  float *out;
  float *in;
  undefined1 local_48 [16];
  
  puVar9 = (undefined8 *)segment->data;
  n = *(uint *)((long)puVar9 + 0x14);
  uVar7 = (ulong)n;
  uVar1 = *(uint *)(puVar9 + 3);
  lVar2 = puVar9[5];
  pSrc = (float *)puVar9[6];
  lVar3 = puVar9[7];
  in_samples = 0xffffffff;
  mixed_buffer_request_read(&in,&in_samples,(mixed_buffer *)*puVar9);
  local_88 = (ulong)n / (ulong)uVar1;
  local_60 = (double)uVar7;
  local_90 = uVar7 - local_88;
  if (puVar9[4] == 0) {
    puVar9[4] = local_90;
  }
  local_68 = (double)*(uint *)(puVar9 + 2) / local_60;
  local_70 = ((double)local_88 * 6.283185307179586) / local_60;
  local_78 = (double)uVar1;
  local_a0 = puVar9;
  for (uVar8 = 0; uVar8 < in_samples; uVar8 = uVar8 + 1) {
    lVar4 = puVar9[4];
    *(float *)(lVar2 + lVar4 * 4) = in[uVar8];
    lVar4 = lVar4 + 1;
    puVar9[4] = lVar4;
    if ((long)uVar7 <= lVar4) {
      out_samples = n;
      local_80 = uVar8;
      mixed_buffer_clear((mixed_buffer *)puVar9[1]);
      mixed_buffer_request_write(&out,&out_samples,(mixed_buffer *)puVar9[1]);
      puVar9[4] = local_90;
      for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        dVar10 = cos(((double)(long)uVar8 * 6.283185307179586) / local_60);
        pSrc[uVar8 * 2] = (float)((double)*(float *)(lVar2 + uVar8 * 4) * (dVar10 * -0.5 + 0.5));
        pSrc[uVar8 * 2 + 1] = 0.0;
      }
      spiral_fft_float(n,-1,pSrc,pSrc);
      uVar12 = extraout_XMM0_Dc;
      uVar13 = extraout_XMM0_Dd;
      for (lVar4 = 0; puVar9 = local_a0, (ulong)(n >> 1) + 1 != lVar4; lVar4 = lVar4 + 1) {
        __x = (double)pSrc[lVar4 * 2];
        dVar11 = (double)pSrc[lVar4 * 2 + 1];
        dVar10 = SQRT(__x * __x + dVar11 * dVar11);
        local_48._8_4_ = uVar12;
        local_48._0_8_ = dVar10 + dVar10;
        local_48._12_4_ = uVar13;
        dVar10 = atan2(dVar11,__x);
        dVar11 = (dVar10 - (double)*(float *)(lVar3 + lVar4 * 4)) - (double)lVar4 * local_70;
        uVar5 = (ulong)(dVar11 / 3.141592653589793);
        uVar8 = uVar5 & 0xfffffffffffffffe;
        if (-1 < (long)uVar5) {
          uVar8 = ((uint)uVar5 & 1) + uVar5;
        }
        *(float *)(lVar3 + lVar4 * 4) = (float)dVar10;
        uVar12 = 0;
        uVar13 = 0;
        *(ulong *)(out + lVar4 * 2) =
             CONCAT44((float)(double)local_48._0_8_,
                      (float)((double)lVar4 * local_68 +
                             ((((double)(long)uVar8 * -3.141592653589793 + dVar11) * local_78) /
                             6.283185307179586) * local_68));
      }
      mixed_buffer_finish_write(out_samples,(mixed_buffer *)local_a0[1]);
      for (lVar4 = 0; uVar8 = local_80, lVar4 < local_90; lVar4 = lVar4 + 1) {
        puVar6 = (undefined4 *)(lVar4 * 4 + lVar2);
        *puVar6 = puVar6[local_88];
      }
    }
  }
  mixed_buffer_finish_read(in_samples,(mixed_buffer *)*puVar9);
  return 1;
}

Assistant:

VECTORIZE int fft_segment_fwd(struct mixed_segment *segment){
  struct fft_segment_data *data = (struct fft_segment_data *)segment->data;
  uint32_t framesize = data->framesize;
  uint32_t oversampling = data->oversampling;
  float *restrict in_fifo = data->fifo;
  float *restrict fft_workspace = data->fft_workspace;
  float *restrict last_phase = data->phase;

  float *restrict in, *restrict out;
  uint32_t in_samples = UINT32_MAX;
  mixed_buffer_request_read(&in, &in_samples, data->in);

  double magnitude, phase, tmp, window, real, imag;
  long i, k, qpd;
  long framesize2 = framesize/2;
  long step = framesize/oversampling;
  double bin_frequencies = (double)data->samplerate/(double)framesize;
  double expected = 2.*M_PI*(double)step/(double)framesize;
  long fifo_latency = framesize-step;
  if (data->overlap == 0) data->overlap = fifo_latency;

  for(i=0; i<in_samples; i++){
    in_fifo[data->overlap] = in[i];
    data->overlap++;
    if(data->overlap >= framesize){
      uint32_t out_samples = framesize;
      mixed_buffer_clear(data->out);
      mixed_buffer_request_write(&out, &out_samples, data->out);
      
      data->overlap = fifo_latency;

      for(k=0; k<framesize; k++){
        window = -.5*cos(2.*M_PI*(double)k/(double)framesize)+.5;
        fft_workspace[2*k] = in_fifo[k] * window;
        fft_workspace[2*k+1] = 0.;
      }

      spiral_fft_float(framesize, -1, fft_workspace, fft_workspace);

      for(k=0; k<=framesize2; k++){
        real = fft_workspace[2*k];
        imag = fft_workspace[2*k+1];
        magnitude = 2.*sqrt(real*real + imag*imag);
        phase = atan2(imag,real);
        
        tmp = phase - last_phase[k];
        last_phase[k] = phase;
        tmp -= (double)k*expected;

        qpd = tmp/M_PI;
        if (qpd >= 0) qpd += qpd&1;
        else qpd -= qpd&1;
        tmp -= M_PI*(double)qpd;

        tmp = oversampling*tmp/(2.*M_PI);
        tmp = (double)k*bin_frequencies + tmp*bin_frequencies;

        out[k*2] = tmp;
        out[k*2+1] = magnitude;
      }
      mixed_buffer_finish_write(out_samples, data->out);
      
      for (k = 0; k < fifo_latency; k++) in_fifo[k] = in_fifo[k+step];
    }
  }
  
  mixed_buffer_finish_read(in_samples, data->in);
  return 1;
}